

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask31_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x1f | uVar1;
  uVar2 = uVar2 >> 1;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[2] = uVar1;
  uVar2 = in[3];
  out[2] = uVar2 << 0x1d | uVar1;
  uVar2 = uVar2 >> 3;
  out[3] = uVar2;
  uVar1 = in[4];
  out[3] = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[4] = uVar1;
  uVar2 = in[5];
  out[4] = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[5] = uVar2;
  uVar1 = in[6];
  out[5] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[6] = uVar1;
  uVar2 = in[7];
  out[6] = uVar2 << 0x19 | uVar1;
  out[7] = uVar2 >> 7;
  return out + 8;
}

Assistant:

uint32_t *__fastpackwithoutmask31_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (31 - 30);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (31 - 29);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (31 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (31 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (31 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (31 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (31 - 24);
  ++in;

  return out + 1;
}